

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O1

uint8_t wasm::parseLaneIndex(Element *s,size_t lanes)

{
  ulong uVar1;
  string *psVar2;
  IString IVar3;
  char *local_a0;
  char *end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 *local_58;
  long local_50;
  undefined1 local_48 [16];
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  IVar3 = Element::str(s);
  uVar1 = strtoll(IVar3.str._M_str,&local_a0,10);
  if ((local_a0 != IVar3.str._M_str) && (*local_a0 == '\0')) {
    if (uVar1 <= lanes) {
      return (uint8_t)uVar1;
    }
    psVar2 = (string *)__cxa_allocate_exception(0x30);
    std::__cxx11::to_string((string *)&end,lanes);
    std::operator+(&local_78,"lane index must be less than ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&end);
    local_38 = (undefined4)s->line;
    uStack_34 = *(undefined4 *)((long)&s->line + 4);
    uStack_30 = (undefined4)s->col;
    uStack_2c = *(undefined4 *)((long)&s->col + 4);
    *(string **)psVar2 = psVar2 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              (psVar2,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    *(undefined4 *)(psVar2 + 0x20) = local_38;
    *(undefined4 *)(psVar2 + 0x24) = uStack_34;
    *(undefined4 *)(psVar2 + 0x28) = uStack_30;
    *(undefined4 *)(psVar2 + 0x2c) = uStack_2c;
    __cxa_throw(psVar2,&ParseException::typeinfo,ParseException::~ParseException);
  }
  psVar2 = (string *)__cxa_allocate_exception(0x30);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Expected lane index","");
  local_38 = (undefined4)s->line;
  uStack_34 = *(undefined4 *)((long)&s->line + 4);
  uStack_30 = (undefined4)s->col;
  uStack_2c = *(undefined4 *)((long)&s->col + 4);
  *(string **)psVar2 = psVar2 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar2,local_58,local_58 + local_50);
  *(undefined4 *)(psVar2 + 0x20) = local_38;
  *(undefined4 *)(psVar2 + 0x24) = uStack_34;
  *(undefined4 *)(psVar2 + 0x28) = uStack_30;
  *(undefined4 *)(psVar2 + 0x2c) = uStack_2c;
  __cxa_throw(psVar2,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

static uint8_t parseLaneIndex(const Element* s, size_t lanes) {
  const char* str = s->str().str.data();
  char* end;
  auto n = static_cast<unsigned long long>(strtoll(str, &end, 10));
  if (end == str || *end != '\0') {
    throw ParseException("Expected lane index", s->line, s->col);
  }
  if (n > lanes) {
    throw ParseException(
      "lane index must be less than " + std::to_string(lanes), s->line, s->col);
  }
  return uint8_t(n);
}